

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_signal_point(game_event_type type,wchar_t x,wchar_t y)

{
  game_event_data data;
  game_event_data local_30;
  
  local_30.point.x = x;
  local_30.point.y = y;
  game_event_dispatch(type,&local_30);
  return;
}

Assistant:

void event_signal_point(game_event_type type, int x, int y)
{
	game_event_data data;
	data.point.x = x;
	data.point.y = y;

	game_event_dispatch(type, &data);
}